

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushPopTest.cpp
# Opt level: O1

void __thiscall
PushPopTest_RandomOrder_Test::PushPopTest_RandomOrder_Test(PushPopTest_RandomOrder_Test *this)

{
  allocator<int> local_19;
  
  testing::Test::Test((Test *)this);
  (this->super_PushPopTest).super_TestWithParam<unsigned_long>.super_Test._vptr_Test =
       (_func_int **)&PTR__PushPopTest_00162c78;
  (this->super_PushPopTest).super_TestWithParam<unsigned_long>.
  super_WithParamInterface<unsigned_long>._vptr_WithParamInterface = (_func_int **)&DAT_00162cb8;
  (this->super_PushPopTest)._A = 0x119;
  (this->super_PushPopTest)._C = 0x6efb;
  (this->super_PushPopTest)._M = 0x20d38;
  (this->super_PushPopTest)._X = 0;
  Deque<int,_std::allocator<int>_>::Deque(&(this->super_PushPopTest).myDeque,&local_19);
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            (&(this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>,0);
  (this->super_PushPopTest).super_TestWithParam<unsigned_long>.super_Test._vptr_Test =
       (_func_int **)&PTR__PushPopTest_00162a10;
  (this->super_PushPopTest).super_TestWithParam<unsigned_long>.
  super_WithParamInterface<unsigned_long>._vptr_WithParamInterface =
       (_func_int **)&PTR__PushPopTest_RandomOrder_Test_00162a50;
  return;
}

Assistant:

TEST_P(PushPopTest, RandomOrder) {
    std::size_t n = GetParam();

    for (std::size_t i = 0; i < n; ++i) {
        int x = nextRandom();
        myDeque.push_back(x);
        stdDeque.push_back(x);
        int y = nextRandom();
        myDeque.push_front(y);
        stdDeque.push_front(y);
    }

    ASSERT_EQ(myDeque.size(), stdDeque.size());

    while (!stdDeque.empty()) {
        int s = stdDeque.back();
        int m = myDeque.back();
        ASSERT_EQ(s, m);
        stdDeque.pop_back();
        myDeque.pop_back();
    }
}